

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_sparse.c
# Opt level: O1

void verify_archive_file(char *name,archive_contents *ac)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  wchar_t wVar4;
  archive *a;
  char *v2;
  char *pcVar5;
  contents *pcVar6;
  long v2_00;
  size_t sVar7;
  archive_contents *paVar8;
  archive_entry *ae;
  void *p;
  longlong local_68;
  size_t sStack_60;
  char *local_58;
  archive_entry *local_48;
  archive_contents *local_40;
  char *local_38;
  
  extract_reference_file(name);
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                   ,L'¼',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0
                  );
  iVar3 = archive_read_support_filter_all(a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                   ,L'½',(uint)(iVar3 == 0),"0 == archive_read_support_filter_all(a)",(void *)0x0);
  wVar4 = archive_read_support_format_tar(a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                   ,L'¾',(uint)(wVar4 == L'\0'),"0 == archive_read_support_format_tar(a)",
                   (void *)0x0);
  failure("Can\'t open %s",name);
  wVar4 = archive_read_open_filename(a,name,3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                   ,L'À',(uint)(wVar4 == L'\0'),"0 == archive_read_open_filename(a, name, 3)",
                   (void *)0x0);
  paVar8 = files;
  do {
    if (paVar8->filename == (char *)0x0) {
      iVar3 = archive_read_next_header(a,&local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                          ,L'ā',1,"ARCHIVE_EOF",(long)iVar3,"err",a);
      iVar3 = archive_read_close(a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                          ,L'ă',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",a);
      iVar3 = archive_read_free(a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                          ,L'Ą',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
      return;
    }
    pcVar6 = paVar8->contents;
    iVar3 = archive_read_next_header(a,&local_48);
    wVar4 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                                ,L'Å',0,"0",(long)iVar3,"archive_read_next_header(a, &ae)",a);
    if (wVar4 == L'\0') {
      iVar3 = archive_read_free(a);
      bVar2 = false;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                          ,L'Æ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
    }
    else {
      failure("Name mismatch in archive %s",name);
      pcVar5 = paVar8->filename;
      local_40 = paVar8;
      v2 = archive_entry_pathname(local_48);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                 ,L'Ê',pcVar5,"ac->filename",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      wVar4 = archive_entry_is_encrypted(local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                          ,L'Ë',(long)wVar4,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar3 = archive_read_has_encrypted_entries(a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                          ,L'Ì',(long)iVar3,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
      v2_00 = pcVar6->o;
      sVar7 = pcVar6->s;
      pcVar5 = pcVar6->d;
      iVar3 = archive_read_data_block(a,&local_38,&sStack_60,&local_68);
      if (iVar3 == 0) {
        pcVar6 = pcVar6 + 1;
        do {
          local_58 = local_38;
          while (sStack_60 != 0) {
            cVar1 = *local_58;
            if (local_68 < v2_00) {
              failure("%s: pad at offset %d should be zero",name);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                                  ,L'Û',(long)cVar1,"c",0,"0",(void *)0x0);
LAB_00165628:
              local_58 = local_58 + 1;
              local_68 = local_68 + 1;
              sStack_60 = sStack_60 - 1;
              bVar2 = true;
            }
            else {
              if (local_68 == v2_00) {
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                                    ,L'à',(long)cVar1,"c",(long)*pcVar5,"*expect.d",(void *)0x0);
                sVar7 = sVar7 - 1;
                if (sVar7 == 0) {
                  v2_00 = pcVar6->o;
                  sVar7 = pcVar6->s;
                  pcVar5 = pcVar6->d;
                  pcVar6 = pcVar6 + 1;
                }
                else {
                  pcVar5 = pcVar5 + 1;
                  v2_00 = v2_00 + 1;
                }
                goto LAB_00165628;
              }
              bVar2 = false;
              failure("%s: Unexpected trailing data",name);
              assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                               ,L'í',(uint)(local_68 <= v2_00),"actual.o <= expect.o",(void *)0x0);
              archive_read_free(a);
            }
            if (!bVar2) {
              bVar2 = false;
              paVar8 = local_40;
              goto LAB_0016568b;
            }
          }
          iVar3 = archive_read_data_block(a,&local_38,&sStack_60,&local_68);
        } while (iVar3 == 0);
      }
      failure("%s: should be end of entry",name);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                          ,L'÷',(long)iVar3,"err",1,"ARCHIVE_EOF",a);
      failure("%s: Size returned at EOF must be zero",name);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                          ,L'ù',(long)(int)sStack_60,"(int)actual.s",0,"0",(void *)0x0);
      failure("%s: Offset of final empty chunk must be same as file size",name);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                          ,L'û',local_68,"actual.o",v2_00,"expect.o",(void *)0x0);
      bVar2 = true;
      paVar8 = local_40 + 1;
    }
LAB_0016568b:
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

static void
verify_archive_file(const char *name, struct archive_contents *ac)
{
	struct archive_entry *ae;
	int err;
	/* data, size, offset of next expected block. */
	struct contents expect;
	/* data, size, offset of block read from archive. */
	struct contents actual;
	const void *p;
	struct archive *a;

	extract_reference_file(name);

	assert((a = archive_read_new()) != NULL);
	assert(0 == archive_read_support_filter_all(a));
	assert(0 == archive_read_support_format_tar(a));
	failure("Can't open %s", name);
	assert(0 == archive_read_open_filename(a, name, 3));

	while (ac->filename != NULL) {
		struct contents *cts = ac->contents;

		if (!assertEqualIntA(a, 0, archive_read_next_header(a, &ae))) {
			assertEqualInt(ARCHIVE_OK, archive_read_free(a));
			return;
		}
		failure("Name mismatch in archive %s", name);
		assertEqualString(ac->filename, archive_entry_pathname(ae));
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		expect = *cts++;
		while (0 == (err = archive_read_data_block(a,
				 &p, &actual.s, &actual.o))) {
			actual.d = p;
			while (actual.s > 0) {
				char c = *actual.d;
				if(actual.o < expect.o) {
					/*
					 * Any byte before the expected
					 * data must be NULL.
					 */
					failure("%s: pad at offset %d "
					    "should be zero", name, actual.o);
					assertEqualInt(c, 0);
				} else if (actual.o == expect.o) {
					/*
					 * Data at matching offsets must match.
					 */
					assertEqualInt(c, *expect.d);
					expect.d++;
					expect.o++;
					expect.s--;
					/* End of expected? step to next expected. */
					if (expect.s <= 0)
						expect = *cts++;
				} else {
					/*
					 * We found data beyond that expected.
					 */
					failure("%s: Unexpected trailing data",
					    name);
					assert(actual.o <= expect.o);
					archive_read_free(a);
					return;
				}
				actual.d++;
				actual.o++;
				actual.s--;
			}
		}
		failure("%s: should be end of entry", name);
		assertEqualIntA(a, err, ARCHIVE_EOF);
		failure("%s: Size returned at EOF must be zero", name);
		assertEqualInt((int)actual.s, 0);
		failure("%s: Offset of final empty chunk must be same as file size", name);
		assertEqualInt(actual.o, expect.o);
		/* Step to next file description. */
		++ac;
	}

	err = archive_read_next_header(a, &ae);
	assertEqualIntA(a, ARCHIVE_EOF, err);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}